

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O2

void sha1_update(sha1_ctx *ctx,uint8_t *input,uint32_t input_len)

{
  uint uVar1;
  ulong __n;
  ulong uVar2;
  
  uVar1 = ctx->count[0];
  ctx->count[0] = input_len * 8 + uVar1;
  ctx->count[1] = ctx->count[1] + (input_len >> 0x1d) + (uint)CARRY4(input_len * 8,uVar1);
  uVar1 = uVar1 >> 3 & 0x3f;
  uVar2 = (ulong)uVar1;
  if (uVar1 + input_len < 0x40) {
    __n = 0;
  }
  else {
    __n = (ulong)(0x40 - uVar1);
    memcpy(ctx->buf + uVar2,input,__n);
    sha1_transform(ctx->state,ctx->buf);
    uVar2 = 0;
    for (; (int)__n + 0x3fU < input_len; __n = (ulong)((int)__n + 0x40)) {
      sha1_transform(ctx->state,input + __n);
    }
  }
  memcpy(ctx->buf + uVar2,input + __n,(ulong)(input_len - (int)__n));
  return;
}

Assistant:

void sha1_update(struct sha1_ctx *ctx, const uint8_t *input,
                 uint32_t input_len) {
  uint32_t i;
  uint32_t j;

  j = ctx->count[0];
  if ((ctx->count[0] += input_len << 3) < j)
    ctx->count[1]++;
  ctx->count[1] += (input_len >> 29);
  j = (j >> 3) & 63;
  if ((j + input_len) > 63) {
    memcpy(&ctx->buf[j], input, (i = 64 - j));
    sha1_transform(ctx->state, ctx->buf);
    for (; i + 63 < input_len; i += 64) {
      sha1_transform(ctx->state, &input[i]);
    }
    j = 0;
  } else {
    i = 0;
  }

  memcpy(&ctx->buf[j], &input[i], input_len - i);
}